

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_v7tar.c
# Opt level: O0

void test_write_format_tar_v7tar(void)

{
  int iVar1;
  wchar_t wVar2;
  la_ssize_t lVar3;
  char local_118 [8];
  char f100 [101];
  char local_a8 [8];
  char f99 [100];
  int local_3c;
  int iStack_38;
  int i;
  size_t used;
  size_t buffsize;
  char *e;
  char *buff;
  archive_entry *entry;
  archive *a;
  
  used = 100000;
  for (local_3c = 0; local_3c < 99; local_3c = local_3c + 1) {
    local_a8[local_3c] = (char)(local_3c % 0x1a) + 'a';
  }
  f99[0x5b] = '\0';
  for (local_3c = 0; local_3c < 100; local_3c = local_3c + 1) {
    local_118[local_3c] = (char)(local_3c % 0x1a) + 'A';
  }
  f100[0x5c] = '\0';
  e = (char *)malloc(100000);
  entry = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'H',(uint)(entry != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_v7tar((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_v7tar(a)",entry);
  iVar1 = archive_write_add_filter_none((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",entry);
  iVar1 = archive_write_open_memory((archive *)entry,e,used,(size_t *)&iStack_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",entry);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'V',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,1,10);
  archive_entry_set_pathname((archive_entry *)buff,"file");
  archive_entry_set_mode((archive_entry *)buff,0x81b4);
  archive_entry_set_size((archive_entry *)buff,10);
  archive_entry_set_uid((archive_entry *)buff,0x50);
  archive_entry_set_gid((archive_entry *)buff,0x5a);
  archive_entry_set_dev((archive_entry *)buff,0xc);
  archive_entry_set_ino((archive_entry *)buff,0x59);
  archive_entry_set_nlink((archive_entry *)buff,2);
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  lVar3 = archive_write_data((archive *)entry,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'b',10,"10",lVar3,"archive_write_data(a, \"1234567890\", 10)",entry);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'e',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,1,10);
  archive_entry_set_pathname((archive_entry *)buff,"linkfile");
  archive_entry_set_hardlink((archive_entry *)buff,"file");
  archive_entry_set_mode((archive_entry *)buff,0x81b4);
  archive_entry_set_size((archive_entry *)buff,10);
  archive_entry_set_uid((archive_entry *)buff,0x50);
  archive_entry_set_gid((archive_entry *)buff,0x5a);
  archive_entry_set_dev((archive_entry *)buff,0xc);
  archive_entry_set_ino((archive_entry *)buff,0x59);
  archive_entry_set_nlink((archive_entry *)buff,2);
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  lVar3 = archive_write_data((archive *)entry,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L's',0,"0",lVar3,"archive_write_data(a, \"1234567890\", 10)",entry);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'v',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,2,0x14);
  archive_entry_set_pathname((archive_entry *)buff,"dir");
  archive_entry_set_mode((archive_entry *)buff,0x41fd);
  archive_entry_set_size((archive_entry *)buff,10);
  archive_entry_set_nlink((archive_entry *)buff,2);
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  lVar3 = archive_write_data((archive *)entry,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x7f',0,"0",lVar3,"archive_write_data(a, \"1234567890\", 10)",entry);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\x82',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,3,0x1e);
  archive_entry_set_pathname((archive_entry *)buff,"symlink");
  archive_entry_set_mode((archive_entry *)buff,0x1b4);
  archive_entry_set_filetype((archive_entry *)buff,0xa000);
  archive_entry_set_symlink((archive_entry *)buff,"file");
  archive_entry_set_size((archive_entry *)buff,0);
  archive_entry_set_uid((archive_entry *)buff,0x58);
  archive_entry_set_gid((archive_entry *)buff,0x62);
  archive_entry_set_dev((archive_entry *)buff,0xc);
  archive_entry_set_ino((archive_entry *)buff,0x5a);
  archive_entry_set_nlink((archive_entry *)buff,1);
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x8e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\x92',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,1,10);
  archive_entry_set_pathname((archive_entry *)buff,local_a8);
  archive_entry_set_mode((archive_entry *)buff,0x81b4);
  archive_entry_set_size((archive_entry *)buff,0);
  archive_entry_set_uid((archive_entry *)buff,0x52);
  archive_entry_set_gid((archive_entry *)buff,0x5d);
  archive_entry_set_dev((archive_entry *)buff,0x66);
  archive_entry_set_ino((archive_entry *)buff,7);
  archive_entry_set_nlink((archive_entry *)buff,1);
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\xa0',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,1,10);
  archive_entry_set_pathname((archive_entry *)buff,local_118);
  archive_entry_set_mode((archive_entry *)buff,0x81b4);
  archive_entry_set_size((archive_entry *)buff,0);
  archive_entry_set_uid((archive_entry *)buff,0x52);
  archive_entry_set_gid((archive_entry *)buff,0x5d);
  archive_entry_set_dev((archive_entry *)buff,0x66);
  archive_entry_set_ino((archive_entry *)buff,7);
  archive_entry_set_nlink((archive_entry *)buff,1);
  failure("100-char filename should be rejected");
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'«',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, entry)",
                      entry);
  archive_entry_free((archive_entry *)buff);
  iVar1 = archive_write_free((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  buffsize = (size_t)e;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'·',e,"e + 0","file","\"file\"",5,"5",(void *)0x0);
  memset((void *)buffsize,0,5);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¸',(void *)(buffsize + 100),"e + 100","000664 ","\"000664 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 100),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¹',(void *)(buffsize + 0x6c),"e + 108","000120 ","\"000120 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x6c),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'º',(void *)(buffsize + 0x74),"e + 116","000132 ","\"000132 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x74),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'»',(void *)(buffsize + 0x7c),"e + 124","00000000012 ","\"00000000012 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x7c),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¼',(void *)(buffsize + 0x88),"e + 136","00000000001 ","\"00000000001 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x88),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'½',(void *)(buffsize + 0x94),"e + 148","005335","\"005335\\0 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x94),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¾',(void *)(buffsize + 0x9c),"e + 156","","\"\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9c),0,1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¿',(void *)(buffsize + 0x9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9d),0,1);
  wVar2 = is_null((char *)buffsize,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'À',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Á',(void *)(buffsize + 0x200),"e + 512","1234567890","\"1234567890\"",10,
                      "10",(void *)0x0);
  memset((void *)(buffsize + 0x200),0,10);
  wVar2 = is_null((char *)(buffsize + 0x200),0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Â',wVar2,"is_null(e + 512, 512)",(void *)0x0);
  buffsize = buffsize + 0x400;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Æ',(void *)buffsize,"e + 0","linkfile","\"linkfile\"",9,"9",(void *)0x0);
  memset((void *)buffsize,0,9);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ç',(void *)(buffsize + 100),"e + 100","000664 ","\"000664 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 100),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'È',(void *)(buffsize + 0x6c),"e + 108","000120 ","\"000120 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x6c),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'É',(void *)(buffsize + 0x74),"e + 116","000132 ","\"000132 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x74),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ê',(void *)(buffsize + 0x7c),"e + 124","00000000000 ","\"00000000000 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x7c),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ë',(void *)(buffsize + 0x88),"e + 136","00000000001 ","\"00000000001 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x88),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ì',(void *)(buffsize + 0x94),"e + 148","007131","\"007131\\0 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x94),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Í',(void *)(buffsize + 0x9c),"e + 156","1","\"1\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9c),0,1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Î',(void *)(buffsize + 0x9d),"e + 157","file","\"file\"",5,"5",(void *)0x0
                     );
  memset((void *)(buffsize + 0x9d),0,5);
  wVar2 = is_null((char *)buffsize,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Ï',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  buffsize = buffsize + 0x200;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ó',(void *)buffsize,"e + 0","dir/","\"dir/\"",4,"4",(void *)0x0);
  memset((void *)buffsize,0,4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ô',(void *)(buffsize + 100),"e + 100","000775 ","\"000775 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 100),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Õ',(void *)(buffsize + 0x6c),"e + 108","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x6c),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ö',(void *)(buffsize + 0x74),"e + 116","000000 ","\"000000 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x74),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'×',(void *)(buffsize + 0x7c),"e + 124","00000000000 ","\"00000000000 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x7c),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ø',(void *)(buffsize + 0x88),"e + 136","00000000002 ","\"00000000002 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x88),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ù',(void *)(buffsize + 0x94),"e + 148","005243","\"005243\\0 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x94),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ú',(void *)(buffsize + 0x9c),"e + 156","","\"\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9c),0,1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Û',(void *)(buffsize + 0x9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9d),0,1);
  wVar2 = is_null((char *)buffsize,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Ü',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  buffsize = buffsize + 0x200;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'à',(void *)buffsize,"e + 0","symlink","\"symlink\"",8,"8",(void *)0x0);
  memset((void *)buffsize,0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'á',(void *)(buffsize + 100),"e + 100","000664 ","\"000664 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 100),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'â',(void *)(buffsize + 0x6c),"e + 108","000130 ","\"000130 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x6c),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ã',(void *)(buffsize + 0x74),"e + 116","000142 ","\"000142 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x74),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ä',(void *)(buffsize + 0x7c),"e + 124","00000000000 ","\"00000000000 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x7c),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'å',(void *)(buffsize + 0x88),"e + 136","00000000003 ","\"00000000003 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x88),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'æ',(void *)(buffsize + 0x94),"e + 148","007027","\"007027\\0 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x94),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ç',(void *)(buffsize + 0x9c),"e + 156","2","\"2\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9c),0,1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'è',(void *)(buffsize + 0x9d),"e + 157","file","\"file\"",5,"5",(void *)0x0
                     );
  memset((void *)(buffsize + 0x9d),0,5);
  wVar2 = is_null((char *)buffsize,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'é',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  buffsize = buffsize + 0x200;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'í',(void *)buffsize,"e + 0",local_a8,"f99",100,"100",(void *)0x0);
  memset((void *)buffsize,0,100);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'î',(void *)(buffsize + 100),"e + 100","000664 ","\"000664 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 100),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ï',(void *)(buffsize + 0x6c),"e + 108","000122 ","\"000122 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x6c),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ð',(void *)(buffsize + 0x74),"e + 116","000135 ","\"000135 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x74),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ñ',(void *)(buffsize + 0x7c),"e + 124","00000000000 ","\"00000000000 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x7c),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ò',(void *)(buffsize + 0x88),"e + 136","00000000001 ","\"00000000001 \"",
                      0xc,"12",(void *)0x0);
  memset((void *)(buffsize + 0x88),0,0xc);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ó',(void *)(buffsize + 0x94),"e + 148","031543","\"031543\\0 \"",8,"8",
                      (void *)0x0);
  memset((void *)(buffsize + 0x94),0,8);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ô',(void *)(buffsize + 0x9c),"e + 156","","\"\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9c),0,1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'õ',(void *)(buffsize + 0x9d),"e + 157","","\"\"",1,"1",(void *)0x0);
  memset((void *)(buffsize + 0x9d),0,1);
  wVar2 = is_null((char *)buffsize,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'ö',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  buffsize = buffsize + 0x200;
  wVar2 = is_null((char *)buffsize,0x400);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'ü',wVar2,"is_null(e, 1024)",(void *)0x0);
  buffsize = buffsize + 0x400;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ÿ',(long)iStack_38,"(int)used",buffsize - (long)e,"e - buff",(void *)0x0);
  free(e);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_v7tar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_v7tar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_hardlink(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	failure("100-char filename should be rejected");
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "005335\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007131\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "1", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "005243\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007027\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "031543\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}